

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

char * sam_hdr_find_line(SAM_hdr *hdr,char *type,char *ID_key,char *ID_value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 *puStack_58;
  int r;
  SAM_hdr_tag *tag;
  kstring_t ks;
  SAM_hdr_type *ty;
  char *ID_value_local;
  char *ID_key_local;
  char *type_local;
  SAM_hdr *hdr_local;
  
  ks.s = (char *)sam_hdr_find(hdr,type,ID_key,ID_value);
  memset(&tag,0,0x18);
  if (ks.s == (char *)0x0) {
    hdr_local = (SAM_hdr *)0x0;
  }
  else {
    iVar2 = kputc_(0x40,(kstring_t *)&tag);
    iVar3 = kputs(type,(kstring_t *)&tag);
    bVar1 = iVar3 == -1 || iVar2 == -1;
    for (puStack_58 = *(undefined8 **)(ks.s + 0x10); puStack_58 != (undefined8 *)0x0;
        puStack_58 = (undefined8 *)*puStack_58) {
      iVar2 = kputc_(9,(kstring_t *)&tag);
      iVar3 = kputsn((char *)puStack_58[1],*(int *)(puStack_58 + 2),(kstring_t *)&tag);
      bVar1 = (bool)(iVar3 == -1 | iVar2 == -1 | bVar1);
    }
    if (bVar1) {
      if (ks.m != 0) {
        free((void *)ks.m);
      }
      hdr_local = (SAM_hdr *)0x0;
    }
    else {
      hdr_local = (SAM_hdr *)ks_str((kstring_t *)&tag);
    }
  }
  return (char *)hdr_local;
}

Assistant:

char *sam_hdr_find_line(SAM_hdr *hdr, char *type,
			char *ID_key, char *ID_value) {
    SAM_hdr_type *ty = sam_hdr_find(hdr, type, ID_key, ID_value);
    kstring_t ks = KS_INITIALIZER;
    SAM_hdr_tag *tag;
    int r = 0;

    if (!ty)
	return NULL;

    // Paste together the line from the hashed copy
    r |= (kputc_('@', &ks) == EOF);
    r |= (kputs(type, &ks) == EOF);
    for (tag = ty->tag; tag; tag = tag->next) {
	r |= (kputc_('\t', &ks) == EOF);
	r |= (kputsn(tag->str, tag->len, &ks) == EOF);
    }

    if (r) {
	KS_FREE(&ks);
	return NULL;
    }

    return ks_str(&ks);
}